

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMaterialNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  aiMaterial *this_00;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  this->m_currentMaterial = this_00;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
            (&this->m_materialCache,&this->m_currentMaterial);
  this->m_tokenType = 0xf;
  handleNodes(this,node,pScene);
  return;
}

Assistant:

void OpenGEXImporter::handleMaterialNode( ODDLParser::DDLNode *node, aiScene *pScene ) {
    m_currentMaterial = new aiMaterial;
    m_materialCache.push_back( m_currentMaterial );
    m_tokenType = Grammar::MaterialToken;
    handleNodes( node, pScene );
}